

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_maketables.c
# Opt level: O1

uint8_t * pcre2_maketables_8(pcre2_general_context_8 *gcontext)

{
  ushort uVar1;
  uint8_t uVar2;
  byte bVar3;
  int iVar4;
  uint8_t *puVar5;
  ushort **ppuVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  byte *pbVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long local_70;
  long local_68;
  long local_58;
  
  if (gcontext == (pcre2_general_context_8 *)0x0) {
    puVar5 = (uint8_t *)malloc(0x440);
  }
  else {
    puVar5 = (uint8_t *)(*(gcontext->memctl).malloc)(0x440,(gcontext->memctl).memory_data);
  }
  if (puVar5 == (uint8_t *)0x0) {
    puVar5 = (uint8_t *)0x0;
  }
  else {
    lVar8 = 0;
    do {
      iVar4 = tolower((int)lVar8);
      puVar5[lVar8] = (uint8_t)iVar4;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x100);
    local_70 = 0x80;
    local_68 = 0xa0;
    lVar15 = 0x20;
    lVar16 = 0xc0;
    lVar9 = 0xe0;
    lVar17 = 0x100;
    local_58 = 0x120;
    ppuVar6 = __ctype_b_loc();
    lVar12 = 0;
    lVar11 = 0x60;
    lVar8 = 0x40;
    do {
      if ((*(byte *)((long)*ppuVar6 + lVar12 * 2 + 1) & 2) == 0) {
        iVar4 = tolower((int)lVar12);
        uVar2 = (uint8_t)iVar4;
      }
      else {
        iVar4 = toupper((int)lVar12);
        uVar2 = (uint8_t)iVar4;
      }
      puVar5[lVar12 + 0x100] = uVar2;
      lVar12 = lVar12 + 1;
      lVar8 = lVar8 + 1;
      lVar11 = lVar11 + 1;
      local_70 = local_70 + 1;
      local_68 = local_68 + 1;
      lVar15 = lVar15 + 1;
      lVar16 = lVar16 + 1;
      lVar9 = lVar9 + 1;
      lVar17 = lVar17 + 1;
      local_58 = local_58 + 1;
    } while (lVar12 != 0x100);
    uVar13 = 0;
    memset(puVar5 + 0x200,0,0x140);
    ppuVar6 = __ctype_b_loc();
    do {
      bVar3 = (byte)uVar13;
      if ((*(byte *)((long)*ppuVar6 + uVar13 * 2 + 1) & 8) != 0) {
        puVar5[(ulong)((uint)(uVar13 >> 3) & 0x1fffffbf) + lVar8 + 0x100] =
             puVar5[(ulong)((uint)(uVar13 >> 3) & 0x1fffffbf) + lVar8 + 0x100] |
             '\x01' << (bVar3 & 7);
      }
      if ((*(byte *)((long)*ppuVar6 + uVar13 * 2 + 1) & 1) != 0) {
        puVar5[(ulong)((uint)(uVar13 >> 3) & 0x1fffff9f) + lVar11 + 0x100] =
             puVar5[(ulong)((uint)(uVar13 >> 3) & 0x1fffff9f) + lVar11 + 0x100] |
             '\x01' << (bVar3 & 7);
      }
      if ((*(byte *)((long)*ppuVar6 + uVar13 * 2 + 1) & 2) != 0) {
        puVar5[(ulong)((uint)(uVar13 >> 3) & 0x1fffff7f) + local_70 + 0x100] =
             puVar5[(ulong)((uint)(uVar13 >> 3) & 0x1fffff7f) + local_70 + 0x100] |
             '\x01' << (bVar3 & 7);
      }
      if (((*ppuVar6)[uVar13] & 8) != 0) {
        puVar5[(ulong)((uint)(uVar13 >> 3) & 0x1fffff5f) + local_68 + 0x100] =
             puVar5[(ulong)((uint)(uVar13 >> 3) & 0x1fffff5f) + local_68 + 0x100] |
             '\x01' << (bVar3 & 7);
      }
      if (uVar13 == 0x5f) {
        puVar5[0x2ab] = puVar5[0x2ab] | 0x80;
      }
      if ((*(byte *)((long)*ppuVar6 + uVar13 * 2 + 1) & 0x20) != 0) {
        puVar5[(uVar13 >> 3) + 0x200] = '\x01' << (bVar3 & 7) | puVar5[(uVar13 >> 3) + 0x200];
      }
      if ((*(byte *)((long)*ppuVar6 + uVar13 * 2 + 1) & 0x10) != 0) {
        puVar5[(ulong)((uint)(uVar13 >> 3) & 0x1fffffdf) + lVar15 + 0x100] =
             puVar5[(ulong)((uint)(uVar13 >> 3) & 0x1fffffdf) + lVar15 + 0x100] |
             '\x01' << (bVar3 & 7);
      }
      if ((short)(*ppuVar6)[uVar13] < 0) {
        puVar5[(ulong)((uint)(uVar13 >> 3) & 0x1fffff3f) + lVar16 + 0x100] =
             puVar5[(ulong)((uint)(uVar13 >> 3) & 0x1fffff3f) + lVar16 + 0x100] |
             '\x01' << (bVar3 & 7);
      }
      if ((*(byte *)((long)*ppuVar6 + uVar13 * 2 + 1) & 0x40) != 0) {
        puVar5[(ulong)((uint)(uVar13 >> 3) & 0x1fffff1f) + lVar9 + 0x100] =
             puVar5[(ulong)((uint)(uVar13 >> 3) & 0x1fffff1f) + lVar9 + 0x100] |
             '\x01' << (bVar3 & 7);
      }
      if (((*ppuVar6)[uVar13] & 4) != 0) {
        puVar5[(ulong)((uint)(uVar13 >> 3) & 0x1ffffeff) + lVar17 + 0x100] =
             puVar5[(ulong)((uint)(uVar13 >> 3) & 0x1ffffeff) + lVar17 + 0x100] |
             '\x01' << (bVar3 & 7);
      }
      if (((*ppuVar6)[uVar13] & 2) != 0) {
        puVar5[(ulong)((uint)(uVar13 >> 3) & 0x1ffffedf) + local_58 + 0x100] =
             puVar5[(ulong)((uint)(uVar13 >> 3) & 0x1ffffedf) + local_58 + 0x100] |
             '\x01' << (bVar3 & 7);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != 0x100);
    pbVar10 = puVar5 + 0x340;
    lVar8 = 0;
    ppuVar6 = __ctype_b_loc();
    do {
      uVar1 = (*ppuVar6)[lVar8];
      bVar3 = (byte)(uVar1 >> 8);
      bVar14 = bVar3 >> 1 & 8 | bVar3 >> 1 & 4 | bVar3 >> 1 & 2 | bVar3 >> 5 & 1;
      bVar3 = bVar14 + 0x10;
      pvVar7 = memchr("\\*+?{^.$|()[",(int)lVar8,0xd);
      if ((uVar1 & 8) != 0) {
        bVar14 = bVar3;
      }
      if (lVar8 == 0x5f) {
        bVar14 = bVar3;
      }
      bVar3 = bVar14 + 0x80;
      if (pvVar7 == (void *)0x0) {
        bVar3 = bVar14;
      }
      *pbVar10 = bVar3;
      pbVar10 = pbVar10 + 1;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x100);
  }
  return puVar5;
}

Assistant:

PCRE2_EXP_DEFN const uint8_t * PCRE2_CALL_CONVENTION
pcre2_maketables(pcre2_general_context *gcontext)
{
uint8_t *yield = (uint8_t *)((gcontext != NULL)?
  gcontext->memctl.malloc(tables_length, gcontext->memctl.memory_data) :
  malloc(tables_length));
#endif  /* DFTABLES */

int i;
uint8_t *p;

if (yield == NULL) return NULL;
p = yield;

/* First comes the lower casing table */

for (i = 0; i < 256; i++) *p++ = tolower(i);

/* Next the case-flipping table */

for (i = 0; i < 256; i++) *p++ = islower(i)? toupper(i) : tolower(i);

/* Then the character class tables. Don't try to be clever and save effort on
exclusive ones - in some locales things may be different.

Note that the table for "space" includes everything "isspace" gives, including
VT in the default locale. This makes it work for the POSIX class [:space:].
From release 8.34 is is also correct for Perl space, because Perl added VT at
release 5.18.

Note also that it is possible for a character to be alnum or alpha without
being lower or upper, such as "male and female ordinals" (\xAA and \xBA) in the
fr_FR locale (at least under Debian Linux's locales as of 12/2005). So we must
test for alnum specially. */

memset(p, 0, cbit_length);
for (i = 0; i < 256; i++)
  {
  if (isdigit(i)) p[cbit_digit  + i/8] |= 1 << (i&7);
  if (isupper(i)) p[cbit_upper  + i/8] |= 1 << (i&7);
  if (islower(i)) p[cbit_lower  + i/8] |= 1 << (i&7);
  if (isalnum(i)) p[cbit_word   + i/8] |= 1 << (i&7);
  if (i == '_')   p[cbit_word   + i/8] |= 1 << (i&7);
  if (isspace(i)) p[cbit_space  + i/8] |= 1 << (i&7);
  if (isxdigit(i))p[cbit_xdigit + i/8] |= 1 << (i&7);
  if (isgraph(i)) p[cbit_graph  + i/8] |= 1 << (i&7);
  if (isprint(i)) p[cbit_print  + i/8] |= 1 << (i&7);
  if (ispunct(i)) p[cbit_punct  + i/8] |= 1 << (i&7);
  if (iscntrl(i)) p[cbit_cntrl  + i/8] |= 1 << (i&7);
  }
p += cbit_length;

/* Finally, the character type table. In this, we used to exclude VT from the
white space chars, because Perl didn't recognize it as such for \s and for
comments within regexes. However, Perl changed at release 5.18, so PCRE changed
at release 8.34. */

for (i = 0; i < 256; i++)
  {
  int x = 0;
  if (isspace(i)) x += ctype_space;
  if (isalpha(i)) x += ctype_letter;
  if (isdigit(i)) x += ctype_digit;
  if (isxdigit(i)) x += ctype_xdigit;
  if (isalnum(i) || i == '_') x += ctype_word;

  /* Note: strchr includes the terminating zero in the characters it considers.
  In this instance, that is ok because we want binary zero to be flagged as a
  meta-character, which in this sense is any character that terminates a run
  of data characters. */

  if (strchr("\\*+?{^.$|()[", i) != 0) x += ctype_meta;
  *p++ = x;
  }

return yield;
}